

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateGetPrototype
          (ImmutableServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  char *pcVar1;
  ServiceDescriptor *pSVar2;
  Nonnull<char_*> pcVar3;
  Descriptor *descriptor;
  long lVar4;
  MethodDescriptor *this_00;
  long lVar5;
  ClassNameResolver *this_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_d0;
  ImmutableServiceGenerator *local_b0;
  ctrl_t *local_a8;
  long local_a0;
  string local_98;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  pcVar1 = "FooResponse";
  if (which == REQUEST) {
    pcVar1 = "FooRequest";
  }
  local_98._M_dataplus._M_p = pcVar1 + 3;
  text._M_str = 
  "public final com.google.protobuf.Message\n    get$request_or_response$Prototype(\n    com.google.protobuf.Descriptors.MethodDescriptor method) {\n  if (method.getService() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"Service.get$request_or_response$Prototype() given method \" +\n      \"descriptor for wrong service type.\");\n  }\n  switch(method.getIndex()) {\n"
  ;
  text._M_len = 0x184;
  io::Printer::Print<char[20],char_const*>
            (printer,text,(char (*) [20])"request_or_response",(char **)&local_98);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  if (0 < pSVar2->method_count_) {
    buffer = &local_98.field_2;
    lVar4 = 0;
    local_a8 = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    lVar5 = 0;
    local_b0 = this;
    do {
      this_00 = (MethodDescriptor *)(&pSVar2->methods_->super_SymbolBase + lVar4);
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0;
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      local_68.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.control = local_a8;
      local_a0 = lVar4;
      pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                         ((int32_t)lVar5,buffer->_M_local_buf);
      local_98._M_dataplus._M_p = pcVar3 + -(long)buffer;
      local_d0.first.ctrl_ = &local_d0.second;
      local_98._M_string_length = (size_type)buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,buffer,pcVar3);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[6]>(&local_48,&local_68,(char (*) [6])0x1104a3a);
      std::__cxx11::string::operator=
                ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_d0);
      if ((bool *)local_d0.first.ctrl_ != &local_d0.second) {
        operator_delete(local_d0.first.ctrl_,local_d0._16_8_ + 1);
      }
      if (which == REQUEST) {
        this_01 = this->name_resolver_;
        descriptor = MethodDescriptor::input_type(this_00);
      }
      else {
        this_01 = this->name_resolver_;
        descriptor = MethodDescriptor::output_type(this_00);
      }
      ClassNameResolver::GetClassName_abi_cxx11_(&local_98,this_01,descriptor,true);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>(&local_d0,&local_68,(char (*) [5])0x1146303);
      std::__cxx11::string::operator=
                ((string *)((long)local_d0.first.field_1.slot_ + 0x10),(string *)&local_98);
      this = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != buffer) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      text_02._M_str = "case $index$:\n  return $type$.getDefaultInstance();\n";
      text_02._M_len = 0x34;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_68,text_02);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set(&local_68);
      lVar5 = lVar5 + 1;
      pSVar2 = (this->super_ServiceGenerator).descriptor_;
      lVar4 = local_a0 + 0x50;
    } while (lVar5 < pSVar2->method_count_);
  }
  text_00._M_str = "default:\n  throw new java.lang.AssertionError(\"Can\'t get here.\");\n";
  text_00._M_len = 0x42;
  io::Printer::Print<>(printer,text_00);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  text_01._M_str = "  }\n}\n\n";
  text_01._M_len = 7;
  io::Printer::Print<>(printer,text_01);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                                     io::Printer* printer) {
  /*
   * TODO: The exception message says "Service.foo" when it may be
   * "BlockingService.foo."  Consider fixing.
   */
  printer->Print(
      "public final com.google.protobuf.Message\n"
      "    get$request_or_response$Prototype(\n"
      "    com.google.protobuf.Descriptors.MethodDescriptor method) {\n"
      "  if (method.getService() != getDescriptor()) {\n"
      "    throw new java.lang.IllegalArgumentException(\n"
      "      \"Service.get$request_or_response$Prototype() given method \" +\n"
      "      \"descriptor for wrong service type.\");\n"
      "  }\n"
      "  switch(method.getIndex()) {\n",
      "request_or_response", (which == REQUEST) ? "Request" : "Response");
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["index"] = absl::StrCat(i);
    vars["type"] =
        (which == REQUEST)
            ? name_resolver_->GetImmutableClassName(method->input_type())
            : GetOutput(method);
    printer->Print(vars,
                   "case $index$:\n"
                   "  return $type$.getDefaultInstance();\n");
  }

  printer->Print(
      "default:\n"
      "  throw new java.lang.AssertionError(\"Can't get here.\");\n");

  printer->Outdent();
  printer->Outdent();

  printer->Print(
      "  }\n"
      "}\n"
      "\n");
}